

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isupper.c
# Opt level: O1

int main(void)

{
  ushort **ppuVar1;
  
  ppuVar1 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar1 + 0x83) & 1) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isupper.c, line %d - %s\n"
           ,0x1a,"isupper( \'A\' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0xb5) & 1) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isupper.c, line %d - %s\n"
           ,0x1b,"isupper( \'Z\' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0xc3) & 1) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isupper.c, line %d - %s\n"
           ,0x1c,"! isupper( \'a\' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0xf5) & 1) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isupper.c, line %d - %s\n"
           ,0x1d,"! isupper( \'z\' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0x41) & 1) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isupper.c, line %d - %s\n"
           ,0x1e,"! isupper( \' \' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0x81) & 1) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isupper.c, line %d - %s\n"
           ,0x1f,"! isupper( \'@\' )");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( isupper( 'A' ) );
    TESTCASE( isupper( 'Z' ) );
    TESTCASE( ! isupper( 'a' ) );
    TESTCASE( ! isupper( 'z' ) );
    TESTCASE( ! isupper( ' ' ) );
    TESTCASE( ! isupper( '@' ) );
    return TEST_RESULTS;
}